

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  int iVar1;
  uint uVar2;
  mbedtls_ct_condition_t mVar3;
  mbedtls_mpi_uint mVar4;
  ulong local_38;
  size_t i;
  mbedtls_ct_condition_t do_not_assign;
  mbedtls_ct_condition_t do_assign;
  int ret;
  uchar assign_local;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  iVar1 = mbedtls_mpi_grow(X,(ulong)Y->n);
  if (iVar1 == 0) {
    mVar3 = mbedtls_ct_bool((ulong)assign);
    uVar2 = mbedtls_ct_uint_if(mVar3,(int)Y->s,(int)X->s);
    X->s = (short)uVar2;
    mbedtls_mpi_core_cond_assign(X->p,Y->p,(ulong)Y->n,mVar3);
    mVar3 = mbedtls_ct_bool_not(mVar3);
    for (local_38 = (ulong)Y->n; local_38 < X->n; local_38 = local_38 + 1) {
      mVar4 = mbedtls_ct_mpi_uint_if_else_0(mVar3,X->p[local_38]);
      X->p[local_38] = mVar4;
    }
  }
  return iVar1;
}

Assistant:

__declspec(noinline)
#endif
int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,
                                 const mbedtls_mpi *Y,
                                 unsigned char assign)
{
    int ret = 0;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));

    {
        mbedtls_ct_condition_t do_assign = mbedtls_ct_bool(assign);

        X->s = (int) mbedtls_ct_uint_if(do_assign, Y->s, X->s);

        mbedtls_mpi_core_cond_assign(X->p, Y->p, Y->n, do_assign);

        mbedtls_ct_condition_t do_not_assign = mbedtls_ct_bool_not(do_assign);
        for (size_t i = Y->n; i < X->n; i++) {
            X->p[i] = mbedtls_ct_mpi_uint_if_else_0(do_not_assign, X->p[i]);
        }
    }

cleanup:
    return ret;
}